

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covec.cpp
# Opt level: O1

bool match(string *s,string *longarg,string *shortarg)

{
  pointer pcVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  pcVar1 = (s->_M_dataplus)._M_p;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,pcVar1,pcVar1 + s->_M_string_length)
  ;
  if (local_48 == longarg->_M_string_length) {
    if (local_48 == 0) {
      bVar3 = true;
    }
    else {
      iVar2 = bcmp(local_50,(longarg->_M_dataplus)._M_p,local_48);
      bVar3 = iVar2 == 0;
    }
  }
  else {
    bVar3 = false;
  }
  bVar4 = true;
  if (!bVar3) {
    local_70 = local_60;
    pcVar1 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + s->_M_string_length);
    if (local_68 == shortarg->_M_string_length) {
      if (local_68 != 0) {
        iVar2 = bcmp(local_70,(shortarg->_M_dataplus)._M_p,local_68);
        bVar4 = iVar2 == 0;
      }
    }
    else {
      bVar4 = false;
    }
  }
  if ((!bVar3) && (local_70 != local_60)) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return bVar4;
}

Assistant:

inline bool match(const std::string& s, const std::string& longarg, const std::string& shortarg)
{ return std::string(s) == longarg || std::string(s) == shortarg; }